

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall
Fl_Text_Buffer::remove_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  int iVar1;
  Fl_Text_Modify_Cb *pp_Var2;
  void **ppvVar3;
  Fl_Text_Modify_Cb *pp_Var4;
  void **ppvVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar1 = this->mNModifyProcs;
  if (0 < (long)iVar1) {
    pp_Var2 = this->mModifyProcs;
    ppvVar3 = this->mCbArgs;
    uVar7 = 0;
    do {
      if ((pp_Var2[uVar7] == bufModifiedCB) && (ppvVar3[uVar7] == cbArg)) {
        uVar8 = iVar1 - 1;
        this->mNModifyProcs = uVar8;
        if (uVar8 == 0) {
          this->mNModifyProcs = 0;
          operator_delete__(pp_Var2);
          this->mModifyProcs = (Fl_Text_Modify_Cb *)0x0;
          if (this->mCbArgs != (void **)0x0) {
            operator_delete__(this->mCbArgs);
          }
          this->mCbArgs = (void **)0x0;
        }
        else {
          pp_Var4 = (Fl_Text_Modify_Cb *)operator_new__((long)(int)uVar8 << 3);
          ppvVar5 = (void **)operator_new__((long)(int)uVar8 << 3);
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar6 = 0;
            do {
              pp_Var4[uVar6] = pp_Var2[uVar6];
              ppvVar5[uVar6] = ppvVar3[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
          if ((int)uVar7 < (int)uVar8) {
            uVar7 = uVar7 & 0xffffffff;
            do {
              pp_Var4[uVar7] = pp_Var2[uVar7 + 1];
              ppvVar5[uVar7] = ppvVar3[uVar7 + 1];
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          operator_delete__(pp_Var2);
          if (this->mCbArgs != (void **)0x0) {
            operator_delete__(this->mCbArgs);
          }
          this->mModifyProcs = pp_Var4;
          this->mCbArgs = ppvVar5;
        }
        return;
      }
      uVar7 = uVar7 + 1;
    } while ((long)iVar1 != uVar7);
  }
  (*Fl::error)("Fl_Text_Buffer::remove_modify_callback(): Can\'t find modify CB to remove",
               bufModifiedCB,cbArg,Fl::error);
  return;
}

Assistant:

void Fl_Text_Buffer::remove_modify_callback(Fl_Text_Modify_Cb bufModifiedCB, 
                                            void *cbArg)
{
  int i, toRemove = -1;
  
  /* find the matching callback to remove */
  for (i = 0; i < mNModifyProcs; i++) {
    if (mModifyProcs[i] == bufModifiedCB && mCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_modify_callback(): Can't find modify CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if
   any are left) */
  mNModifyProcs--;
  if (mNModifyProcs == 0) {
    mNModifyProcs = 0;
    delete[]mModifyProcs;
    mModifyProcs = NULL;
    delete[]mCbArgs;
    mCbArgs = NULL;
    return;
  }
  Fl_Text_Modify_Cb *newModifyProcs = new Fl_Text_Modify_Cb[mNModifyProcs];
  void **newCBArgs = new void *[mNModifyProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newModifyProcs[i] = mModifyProcs[i];
    newCBArgs[i] = mCbArgs[i];
  }
  for (; i < mNModifyProcs; i++) {
    newModifyProcs[i] = mModifyProcs[i + 1];
    newCBArgs[i] = mCbArgs[i + 1];
  }
  delete[]mModifyProcs;
  delete[]mCbArgs;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}